

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void sznet::net::defaultConnectionCallback(TcpConnectionPtr *conn)

{
  ulong __n;
  StateE SVar1;
  char *__src;
  int iVar2;
  SourceFile file;
  Logger local_1030;
  string local_60;
  string local_40;
  
  if (g_logLevel < 1) {
    file._8_8_ = 0x11;
    file.m_data = "TcpConnection.cpp";
    Logger::Logger(&local_1030,file,0x13,TRACE,"defaultConnectionCallback");
    InetAddress::toIpPort_abi_cxx11_
              (&local_40,
               &((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->m_localAddr);
    iVar2 = (int)&local_1030 + 0xfb0;
    if (local_40._M_string_length <
        (ulong)(long)(iVar2 - (int)local_1030.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_1030.m_impl.m_stream.m_buffer.m_cur,local_40._M_dataplus._M_p,
             local_40._M_string_length);
      local_1030.m_impl.m_stream.m_buffer.m_cur =
           local_1030.m_impl.m_stream.m_buffer.m_cur + local_40._M_string_length;
    }
    if (4 < (uint)(iVar2 - (int)local_1030.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1030.m_impl.m_stream.m_buffer.m_cur," -> ",4);
      local_1030.m_impl.m_stream.m_buffer.m_cur = local_1030.m_impl.m_stream.m_buffer.m_cur + 4;
    }
    InetAddress::toIpPort_abi_cxx11_
              (&local_60,
               &((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->m_peerAddr);
    if (local_60._M_string_length <
        (ulong)(long)(iVar2 - (int)local_1030.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_1030.m_impl.m_stream.m_buffer.m_cur,local_60._M_dataplus._M_p,
             local_60._M_string_length);
      local_1030.m_impl.m_stream.m_buffer.m_cur =
           local_1030.m_impl.m_stream.m_buffer.m_cur + local_60._M_string_length;
    }
    if (4 < (uint)(iVar2 - (int)local_1030.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1030.m_impl.m_stream.m_buffer.m_cur," is ",4);
      local_1030.m_impl.m_stream.m_buffer.m_cur = local_1030.m_impl.m_stream.m_buffer.m_cur + 4;
    }
    SVar1 = ((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->m_state;
    __n = (ulong)(SVar1 != kConnected) * 2 + 2;
    if (__n < (ulong)(long)(iVar2 - (int)local_1030.m_impl.m_stream.m_buffer.m_cur)) {
      __src = "DOWN";
      if (SVar1 == kConnected) {
        __src = "UP";
      }
      memcpy(local_1030.m_impl.m_stream.m_buffer.m_cur,__src,__n);
      local_1030.m_impl.m_stream.m_buffer.m_cur = local_1030.m_impl.m_stream.m_buffer.m_cur + __n;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    Logger::~Logger(&local_1030);
  }
  return;
}

Assistant:

void defaultConnectionCallback(const TcpConnectionPtr& conn)
{
	LOG_TRACE << conn->localAddress().toIpPort() << " -> "
		<< conn->peerAddress().toIpPort() << " is "
		<< (conn->connected() ? "UP" : "DOWN");
	// do not call conn->forceClose(), because some users want to register message callback only.
}